

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

int LiteScript::Syntax::ReadOperator
              (char *text,
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              *op,bool *need_value,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  byte bVar1;
  char cVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pOVar7;
  Operators OVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ErrorType *errorType_00;
  ErrorType *errorType_01;
  bool bVar12;
  int iVar13;
  string name;
  Instruction local_40;
  
  *need_value = true;
  bVar1 = *text;
  errorType_00 = (ErrorType *)(ulong)(bVar1 - 0x21);
  if (bVar1 - 0x21 < 0x1f) {
    errorType_01 = (ErrorType *)
                   ((long)&switchD_001384f9::switchdataD_0014221c +
                   (long)(int)(&switchD_001384f9::switchdataD_0014221c)[(long)errorType_00]);
    switch(errorType_00) {
    case (ErrorType *)0x0:
      if (text[1] != '=') {
        *errorType = SCRPT_ERROR_OPERATOR;
        return 0xffffffff;
      }
      OVar8 = OP_DIF;
      break;
    default:
switchD_001384f9_caseD_22:
      *need_value = false;
      return 0;
    case (ErrorType *)0x4:
      OVar8 = OP_MOD;
      goto LAB_00138ad9;
    case (ErrorType *)0x5:
      if (text[1] != '&') {
        OVar8 = OP_BIT_AND;
        goto LAB_00138ad9;
      }
      OVar8 = OP_AND;
      break;
    case (ErrorType *)0x7:
      while ((pOVar7 = (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
             pOVar7 != (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_start &&
             (OP_Priority[pOVar7[-1]] == '\x01'))) {
        PopOperator(op,instrl);
      }
      Instruction::Instruction((Instruction *)&name,INSTR_PUSH_ARGS);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&name);
      Instruction::~Instruction((Instruction *)&name);
      bVar12 = true;
      iVar11 = 0;
      iVar13 = 1;
      while( true ) {
        cVar2 = text[iVar13];
        if (cVar2 == ')') break;
        uVar10 = ReadWhitespace(text + iVar13);
        if (uVar10 == 0) {
          if (bVar12) {
            uVar10 = ReadExpression((Syntax *)(text + iVar13),(char *)instrl,
                                    (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                     *)errorType,errorType_01);
            if ((int)uVar10 < 1) {
              if ((int)uVar10 < 0) {
                return uVar10 - iVar13;
              }
LAB_00138b57:
              *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
              goto LAB_00138b62;
            }
            Instruction::Instruction((Instruction *)&name,INSTR_DEFINE_ARG,iVar11);
            std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
            emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&name);
            iVar11 = iVar11 + 1;
            Instruction::~Instruction((Instruction *)&name);
            bVar12 = false;
          }
          else {
            bVar12 = true;
            uVar10 = 1;
            if (cVar2 != ',') goto LAB_00138b57;
          }
        }
        iVar13 = iVar13 + uVar10;
      }
      if (!(bool)(bVar12 & 0 < iVar11)) {
        pOVar7 = (op->
                 super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((pOVar7 == (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_start) || (pOVar7[-1] != OP_NEW)) {
          Instruction::Instruction((Instruction *)&name,INSTR_OP_CALL);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
          emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&name);
        }
        else {
          (op->
          super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
          )._M_impl.super__Vector_impl_data._M_finish = pOVar7 + -1;
          Instruction::Instruction((Instruction *)&name,INSTR_VALUE_OBJECT);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
          emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&name);
        }
LAB_00138b3e:
        Instruction::~Instruction((Instruction *)&name);
        *need_value = false;
        return iVar13 + 1;
      }
      *errorType = SCRPT_ERROR_EXPRESSION;
LAB_00138b62:
      return -iVar13;
    case (ErrorType *)0x9:
      if (text[1] != '=') {
        OVar8 = OP_MUL;
        goto LAB_00138ad9;
      }
      OVar8 = OP_MUL_ASSIGN;
      break;
    case (ErrorType *)0xa:
      if (text[1] != '=') {
        OVar8 = OP_ADD;
        goto LAB_00138ad9;
      }
      OVar8 = OP_ADD_ASSIGN;
      break;
    case (ErrorType *)0xc:
      if (text[1] != '=') {
        OVar8 = OP_SUB;
        goto LAB_00138ad9;
      }
      OVar8 = OP_SUB_ASSIGN;
      break;
    case (ErrorType *)0xd:
      while ((pOVar7 = (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
             pOVar7 != (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_start &&
             (OP_Priority[pOVar7[-1]] == '\x01'))) {
        PopOperator(op,instrl);
      }
      uVar9 = ReadWhitespace(text + 1);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      uVar10 = ReadName(text + (long)(int)uVar9 + 1,&name);
      if (uVar10 == 0) {
        *errorType = SCRPT_ERROR_NAME;
        uVar10 = ~uVar9;
      }
      else {
        Instruction::Instruction(&local_40,INSTR_OP_MEMBER,name._M_dataplus._M_p);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,&local_40);
        uVar10 = uVar10 + uVar9 + 1;
        Instruction::~Instruction(&local_40);
        *need_value = false;
      }
      std::__cxx11::string::~string((string *)&name);
      return uVar10;
    case (ErrorType *)0xe:
      if (text[1] != '=') {
        OVar8 = OP_DIV;
        goto LAB_00138ad9;
      }
      OVar8 = OP_DIV_ASSIGN;
      break;
    case (ErrorType *)0x1b:
      if (text[1] == '<') {
        OVar8 = OP_LSHIFT;
      }
      else {
        if (text[1] != '=') {
          OVar8 = OP_LESS;
          goto LAB_00138ad9;
        }
        OVar8 = OP_LESS_EQU;
      }
      break;
    case (ErrorType *)0x1c:
      if (text[1] != '=') {
        OVar8 = OP_ASSIGN;
        goto LAB_00138ad9;
      }
      OVar8 = OP_EQU;
      break;
    case (ErrorType *)0x1d:
      if (text[1] == '>') {
        OVar8 = OP_RSHIFT;
      }
      else {
        if (text[1] != '=') {
          OVar8 = OP_GREAT;
          goto LAB_00138ad9;
        }
        OVar8 = OP_GREAT_EQU;
      }
      break;
    case (ErrorType *)0x1e:
      while ((pOVar7 = (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
             pOVar7 != (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_start &&
             (OP_Priority[pOVar7[-1]] == OP_Priority[0x1e]))) {
        PopOperator(op,instrl);
      }
      pIVar3 = (instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pIVar4 = (instrl->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = ReadWhitespace(text + 1);
      Instruction::Instruction((Instruction *)&name,INSTR_JUMP_ELSE);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&name);
      iVar13 = uVar10 + 1;
      Instruction::~Instruction((Instruction *)&name);
      iVar11 = ReadExpression((Syntax *)(text + iVar13),(char *)instrl,
                              (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               *)errorType,errorType_01);
      if (0 < iVar11) {
        uVar10 = ReadWhitespace(text + (iVar11 + iVar13));
        pIVar5 = (instrl->
                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pIVar6 = (instrl->
                 super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        Instruction::Instruction((Instruction *)&name,INSTR_JUMP_TO);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&name);
        Instruction::~Instruction((Instruction *)&name);
        Instruction::Instruction
                  ((Instruction *)&name,INSTR_JUMP_ELSE,
                   (int)((ulong)((long)(instrl->
                                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(instrl->
                                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 4));
        Instruction::operator=
                  ((Instruction *)
                   (&((instrl->
                      super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                      )._M_impl.super__Vector_impl_data._M_start)->code +
                   (((long)pIVar3 - (long)pIVar4) * 0x10000000 >> 0x1c)),(Instruction *)&name);
        iVar13 = uVar10 + iVar11 + iVar13;
        Instruction::~Instruction((Instruction *)&name);
        if (text[iVar13] != ':') {
          *errorType = SCRPT_ERROR_COLON;
          return -iVar13;
        }
        uVar10 = ReadWhitespace(text + iVar13);
        iVar13 = uVar10 + iVar13;
        iVar11 = ReadExpression((Syntax *)(text + iVar13),(char *)instrl,
                                (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                 *)errorType,errorType_01);
        if (0 < iVar11) {
          Instruction::Instruction
                    ((Instruction *)&name,INSTR_JUMP_TO,
                     (int)((ulong)((long)(instrl->
                                         super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(instrl->
                                        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 4));
          Instruction::operator=
                    ((Instruction *)
                     (&((instrl->
                        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                        )._M_impl.super__Vector_impl_data._M_start)->code +
                     (((long)pIVar5 - (long)pIVar6) * 0x10000000 >> 0x1c)),(Instruction *)&name);
          Instruction::~Instruction((Instruction *)&name);
          return iVar13 + iVar11;
        }
        if (iVar11 == 0) {
          *errorType = SCRPT_ERROR_EXPRESSION;
          return -iVar13;
        }
        return iVar11 - iVar13;
      }
LAB_00138a24:
      if (iVar11 != 0) {
        return iVar11 - iVar13;
      }
      *errorType = SCRPT_ERROR_EXPRESSION;
      return ~uVar10;
    }
LAB_00138ac3:
    PushOperator(op,OVar8,instrl);
    uVar10 = 2;
  }
  else {
    if (bVar1 == 0x5b) {
      while ((pOVar7 = (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
             pOVar7 != (op->
                       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                       )._M_impl.super__Vector_impl_data._M_start &&
             (OP_Priority[pOVar7[-1]] == '\x01'))) {
        PopOperator(op,instrl);
      }
      uVar10 = ReadWhitespace(text + 1);
      iVar13 = uVar10 + 1;
      iVar11 = ReadExpression((Syntax *)(text + (long)(int)uVar10 + 1),(char *)instrl,
                              (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               *)errorType,errorType_00);
      if (iVar11 < 1) goto LAB_00138a24;
      uVar10 = ReadWhitespace(text + (iVar13 + iVar11));
      iVar13 = iVar13 + iVar11 + uVar10;
      if (text[iVar13] == ']') {
        Instruction::Instruction((Instruction *)&name,INSTR_OP_ARRAY);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
        emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&name);
        goto LAB_00138b3e;
      }
      *errorType = SCRPT_ERROR_BRACKET_CLOSE;
      goto LAB_00138b62;
    }
    if (bVar1 == 0x5e) {
      OVar8 = OP_BIT_XOR;
    }
    else {
      if (bVar1 != 0x7c) goto switchD_001384f9_caseD_22;
      if (text[1] == '|') {
        OVar8 = OP_OR;
        goto LAB_00138ac3;
      }
      OVar8 = OP_BIT_OR;
    }
LAB_00138ad9:
    PushOperator(op,OVar8,instrl);
    uVar10 = 1;
  }
  return uVar10;
}

Assistant:

int LiteScript::Syntax::ReadOperator(const char *text, std::vector<Operators> &op, bool& need_value, std::vector<Instruction> &instrl,
                                     Script::ErrorType &errorType) {
    need_value = true;
    if (text[0] == '(') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        instrl.push_back(Instruction(InstrCode::INSTR_PUSH_ARGS));
        int i = 1, index = 0;
        union {
            int i;
            unsigned int ui;
        } tmp;
        bool need_arg = true;
        while (text[i] != ')') {
            if ((tmp.ui = ReadWhitespace(text + i)) > 0)
                i += (int)tmp.ui;
            else if (need_arg && (tmp.i = ReadExpression(text + i, instrl, errorType)) > 0) {
                i += tmp.i;
                need_arg = false;
                instrl.push_back(Instruction(InstrCode::INSTR_DEFINE_ARG, index++));
            }
            else if (tmp.i < 0)
                return tmp.i - i;
            else if (!need_arg && text[i] == ',') {
                i++;
                need_arg = true;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
                return -i;
            }
        }
        if (need_arg && index > 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
        if (op.size() > 0 && op.back() == Operators::OP_NEW) {
            op.pop_back();
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_OBJECT));
        }
        else
            instrl.push_back(Instruction(InstrCode::INSTR_OP_CALL));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '[') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1, tmp;
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        if (text[i] != ']') {
            errorType = Script::ErrorType::SCRPT_ERROR_BRACKET_CLOSE;
            return -i;
        }
        instrl.push_back(Instruction(InstrCode::INSTR_OP_ARRAY));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '.') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1;
        i += (int)ReadWhitespace(text + i);
        unsigned int tmp;
        std::string name;
        if ((tmp = ReadName(text + i, name)) == 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_NAME;
            return -i;
        }
        i += (int)tmp;
        instrl.push_back(Instruction(InstrCode::INSTR_OP_MEMBER, name.c_str()));
        need_value = false;
        return i;
    }
    else if (text[0] == '?') {
        while (op.size() > 0 && OP_Priority[op.back()] == OP_Priority[Operators::OP_ASSIGN])
            PopOperator(op, instrl);
        int i = 1, tmp, line_je = instrl.size();
        i += (int)ReadWhitespace(text + i);
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_ELSE));
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        int line_jt = instrl.size();
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
        instrl[line_je] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
        if (text[i] != ':') {
            errorType = Script::ErrorType::SCRPT_ERROR_COLON;
            return -i;
        }
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        instrl[line_jt] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
        i += tmp;
        return i;
    }
    else {
        switch (text[0]) {
            case '+':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_ADD_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ADD, instrl);
                    return 1;
                }
            case '-':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_SUB_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_SUB, instrl);
                    return 1;
                }
            case '*':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_MUL_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_MUL, instrl);
                    return 1;
                }
            case '/':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIV_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_DIV, instrl);
                    return 1;
                }
            case '%':
                PushOperator(op, Operators::OP_MOD, instrl);
                return 1;
            case '=':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_EQU, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ASSIGN, instrl);
                    return 1;
                }
            case '!':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIF, instrl);
                    return 2;
                }
                else {
                    errorType = Script::ErrorType::SCRPT_ERROR_OPERATOR;
                    return -1;
                }
            case '<':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_LESS_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '<') {
                    PushOperator(op, Operators::OP_LSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_LESS, instrl);
                    return 1;
                }
            case '>':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_GREAT_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '>') {
                    PushOperator(op, Operators::OP_RSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_GREAT, instrl);
                    return 1;
                }
            case '&':
                if (text[1] == '&') {
                    PushOperator(op, Operators::OP_AND, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_AND, instrl);
                    return 1;
                }
            case '|':
                if (text[1] == '|') {
                    PushOperator(op, Operators::OP_OR, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_OR, instrl);
                    return 1;
                }
            case '^':
                PushOperator(op, Operators::OP_BIT_XOR, instrl);
                return 1;
            default:
                need_value = false;
                return 0;
        }
    }
}